

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

int AddWordToVocab(char *word)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  uint local_18;
  uint local_14;
  uint length;
  uint hash;
  char *word_local;
  
  sVar1 = strlen(word);
  local_18 = (int)sVar1 + 1;
  if (100 < local_18) {
    local_18 = 100;
  }
  pcVar2 = (char *)calloc((ulong)local_18,1);
  vocab[vocab_size].word = pcVar2;
  strcpy(vocab[vocab_size].word,word);
  vocab[vocab_size].cn = 0;
  lVar3 = vocab_size + 1;
  lVar4 = vocab_size + 3;
  vocab_size = lVar3;
  if (vocab_max_size <= lVar4) {
    vocab_max_size = vocab_max_size + 1000;
    vocab = (vocab_word *)realloc(vocab,vocab_max_size * 0x28);
  }
  for (local_14 = GetWordHash(word); vocab_hash[local_14] != -1;
      local_14 = (local_14 + 1) % 30000000) {
  }
  vocab_hash[local_14] = (int)vocab_size + -1;
  return (int)vocab_size + -1;
}

Assistant:

int AddWordToVocab(char *word) {
  unsigned int hash, length = strlen(word) + 1;
  if (length > MAX_STRING) length = MAX_STRING;
  vocab[vocab_size].word = (char *)calloc(length, sizeof(char));
  strcpy(vocab[vocab_size].word, word);
  vocab[vocab_size].cn = 0;
  vocab_size++;
  // Reallocate memory if needed
  if (vocab_size + 2 >= vocab_max_size) {
    vocab_max_size += 1000;
    vocab = (struct vocab_word *)realloc(vocab, vocab_max_size * sizeof(struct vocab_word));
  }
  hash = GetWordHash(word);
  while (vocab_hash[hash] != -1) hash = (hash + 1) % vocab_hash_size;
  vocab_hash[hash] = vocab_size - 1;
  return vocab_size - 1;
}